

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncTee::ReadSink>::
AdapterPromiseNode<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink&>&,kj::ArrayPtr<unsigned_char>&,unsigned_long&,unsigned_long&>
          (AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncTee::ReadSink> *this,
          Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *params,
          ArrayPtr<unsigned_char> *params_1,unsigned_long *params_2,unsigned_long *params_3)

{
  size_t minBytes;
  ArrayPtr<unsigned_char> buffer;
  Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *registration;
  ArrayPtr<unsigned_char> *pAVar1;
  unsigned_long *puVar2;
  unsigned_long *params_local_3;
  unsigned_long *params_local_2;
  ArrayPtr<unsigned_char> *params_local_1;
  Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *params_local;
  AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncTee::ReadSink> *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<unsigned_long>::PromiseFulfiller
            ((PromiseFulfiller<unsigned_long> *)(this + 0x18));
  *(undefined ***)this = &PTR_destroy_00c10cc8;
  *(undefined ***)(this + 0x18) = &PTR_reject_00c10d18;
  ExceptionOr<unsigned_long>::ExceptionOr((ExceptionOr<unsigned_long> *)(this + 0x20));
  this[0x1c8] = (AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncTee::ReadSink>)0x1
  ;
  registration = fwd<kj::Maybe<kj::(anonymous_namespace)::AsyncTee::Sink&>&>(params);
  pAVar1 = fwd<kj::ArrayPtr<unsigned_char>&>(params_1);
  buffer = *pAVar1;
  puVar2 = fwd<unsigned_long&>(params_2);
  minBytes = *puVar2;
  puVar2 = fwd<unsigned_long&>(params_3);
  anon_unknown_123::AsyncTee::ReadSink::ReadSink
            ((ReadSink *)(this + 0x1d0),(PromiseFulfiller<unsigned_long> *)(this + 0x18),
             registration,buffer,minBytes,*puVar2);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}